

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransportMan.cpp
# Opt level: O3

void __thiscall
adios2::transportman::TransportMan::WriteFiles
          (TransportMan *this,iovec *iov,size_t iovcnt,int transportIndex)

{
  _Hash_node_base *p_Var1;
  uint uVar2;
  int iVar3;
  iterator itTransport;
  long *plVar4;
  uint uVar5;
  size_t *psVar6;
  ulong uVar7;
  uint __val;
  TransportMan *this_00;
  uint __len;
  _func_int **local_70 [2];
  _func_int *local_60 [2];
  string local_50;
  
  if (transportIndex == -1) {
    for (p_Var1 = (this->m_Transports)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0
        ; p_Var1 = p_Var1->_M_nxt) {
      iVar3 = std::__cxx11::string::compare((char *)(p_Var1[2]._M_nxt + 1));
      if (iVar3 == 0) {
        (*(code *)(p_Var1[2]._M_nxt)->_M_nxt[7]._M_nxt)
                  (p_Var1[2]._M_nxt,iov,iovcnt & 0xffffffff,0xffffffffffffffff);
      }
    }
  }
  else {
    local_70[0] = (_func_int **)(long)transportIndex;
    itTransport = std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->m_Transports)._M_h,(key_type *)local_70);
    __val = -transportIndex;
    if (0 < transportIndex) {
      __val = transportIndex;
    }
    __len = 1;
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar5 = (uint)uVar7;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0063f793;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0063f793;
        }
        if (uVar5 < 10000) goto LAB_0063f793;
        uVar7 = uVar7 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0063f793:
    local_70[0] = local_60;
    this_00 = (TransportMan *)local_70;
    std::__cxx11::string::_M_construct((ulong)this_00,(char)__len - (char)(transportIndex >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)((uint)transportIndex >> 0x1f) + (long)local_70[0]),__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)this_00,0,(char *)0x0,0x74eff2);
    psVar6 = (size_t *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50.field_2._8_8_ = plVar4[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_50._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    CheckFile(this_00,(const_iterator)
                      itTransport.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                      ._M_cur,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    (**(code **)(**(long **)((long)itTransport.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                                   ._M_cur + 0x10) + 0x38))
              (*(long **)((long)itTransport.
                                super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<adios2::Transport>_>,_false>
                                ._M_cur + 0x10),iov,iovcnt & 0xffffffff,0xffffffffffffffff);
  }
  return;
}

Assistant:

void TransportMan::WriteFiles(const core::iovec *iov, const size_t iovcnt, const int transportIndex)
{
    if (transportIndex == -1)
    {
        for (auto &transportPair : m_Transports)
        {
            auto &transport = transportPair.second;
            if (transport->m_Type == "File")
            {
                transport->WriteV(iov, static_cast<int>(iovcnt));
            }
        }
    }
    else
    {
        auto itTransport = m_Transports.find(transportIndex);
        CheckFile(itTransport,
                  ", in call to WriteFiles with index " + std::to_string(transportIndex));
        itTransport->second->WriteV(iov, static_cast<int>(iovcnt));
    }
}